

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void embree::deleteGeometry(ISPCGeometry *geom)

{
  if (geom != (ISPCGeometry *)0x0) {
    switch(geom->type) {
    case TRIANGLE_MESH:
      ISPCTriangleMesh::~ISPCTriangleMesh((ISPCTriangleMesh *)geom);
      alignedUSMFree(geom);
      break;
    case SUBDIV_MESH:
      ISPCSubdivMesh::~ISPCSubdivMesh((ISPCSubdivMesh *)geom);
      alignedUSMFree(geom);
      break;
    case CURVES:
      ISPCHairSet::~ISPCHairSet((ISPCHairSet *)geom);
      alignedUSMFree(geom);
      break;
    case INSTANCE:
      ISPCInstance::~ISPCInstance((ISPCInstance *)geom);
      alignedUSMFree(geom);
      break;
    case INSTANCE_ARRAY:
      ISPCInstanceArray::~ISPCInstanceArray((ISPCInstanceArray *)geom);
      alignedUSMFree(geom);
      break;
    case GROUP:
      ISPCGroup::~ISPCGroup((ISPCGroup *)geom);
      alignedUSMFree(geom);
      break;
    case QUAD_MESH:
      ISPCQuadMesh::~ISPCQuadMesh((ISPCQuadMesh *)geom);
      alignedUSMFree(geom);
      break;
    case GRID_MESH:
      ISPCGridMesh::~ISPCGridMesh((ISPCGridMesh *)geom);
      alignedUSMFree(geom);
      break;
    case POINTS:
      ISPCPointSet::~ISPCPointSet((ISPCPointSet *)geom);
      alignedUSMFree(geom);
    }
  }
  return;
}

Assistant:

void deleteGeometry(ISPCGeometry* geom)
  {
    if (geom == nullptr)
      return;
    
    switch (geom->type) {
    case TRIANGLE_MESH: delete (ISPCTriangleMesh*) geom; break;
    case SUBDIV_MESH  : delete (ISPCSubdivMesh*) geom; break;
    case INSTANCE: delete (ISPCInstance*) geom; break;
    case INSTANCE_ARRAY: delete (ISPCInstanceArray*) geom; break;
    case GROUP: delete (ISPCGroup*) geom; break;
    case QUAD_MESH: delete (ISPCQuadMesh*) geom; break;
    case CURVES: delete (ISPCHairSet*) geom; break;
    case GRID_MESH: delete (ISPCGridMesh*) geom; break;
    case POINTS: delete (ISPCPointSet*) geom; break;
    default: assert(false); break;
    }
  }